

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void VP8LDoFillBitWindow(VP8LBitReader *br)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  sVar1 = br->pos_;
  if (sVar1 + 8 < br->len_) {
    uVar5 = br->val_;
    br->val_ = uVar5 >> 0x20;
    br->bit_pos_ = br->bit_pos_ + -0x20;
    br->val_ = (ulong)*(uint *)(br->buf_ + sVar1) << 0x20 | uVar5 >> 0x20;
    br->pos_ = sVar1 + 4;
    return;
  }
  bVar3 = true;
  if (7 < br->bit_pos_) {
    uVar5 = br->pos_;
    iVar4 = br->bit_pos_;
    do {
      iVar6 = iVar4;
      if (br->len_ <= uVar5) break;
      uVar2 = br->val_;
      br->val_ = uVar2 >> 8;
      br->val_ = (ulong)br->buf_[uVar5] << 0x38 | uVar2 >> 8;
      uVar5 = uVar5 + 1;
      br->pos_ = uVar5;
      iVar6 = iVar4 + -8;
      br->bit_pos_ = iVar6;
      bVar3 = 0xf < iVar4;
      iVar4 = iVar6;
    } while (bVar3);
    bVar3 = iVar6 < 0x41;
  }
  if ((br->eos_ != 0) || (!(bool)(br->pos_ != br->len_ | bVar3))) {
    br->bit_pos_ = 0;
    br->eos_ = 1;
  }
  return;
}

Assistant:

void VP8LDoFillBitWindow(VP8LBitReader* const br) {
  assert(br->bit_pos_ >= VP8L_WBITS);
#if defined(VP8L_USE_FAST_LOAD)
  if (br->pos_ + sizeof(br->val_) < br->len_) {
    br->val_ >>= VP8L_WBITS;
    br->bit_pos_ -= VP8L_WBITS;
    br->val_ |= (vp8l_val_t)HToLE32(WebPMemToUint32(br->buf_ + br->pos_)) <<
                (VP8L_LBITS - VP8L_WBITS);
    br->pos_ += VP8L_LOG8_WBITS;
    return;
  }
#endif
  ShiftBytes(br);       // Slow path.
}